

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

bool __thiscall CppGenerator::requireHash(CppGenerator *this,size_t *view_id,size_t *rel_id)

{
  View *pVVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  pVVar1 = QueryCompiler::getView
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*view_id);
  bVar4 = true;
  uVar2 = 0;
  lVar3 = 0;
  do {
    if (((pVVar1->_fVars).super__Base_bitset<2UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
      if (uVar2 != this->sortOrders[*rel_id][lVar3]) {
        return bVar4;
      }
      lVar3 = lVar3 + 1;
    }
    bVar4 = uVar2 < 99;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 100);
  return bVar4;
}

Assistant:

bool CppGenerator::requireHash(const size_t& view_id, const size_t& rel_id)
{
    View* view = _qc->getView(view_id);
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (view->_fVars[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}